

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O1

bool GetDealSpecificMove(int card_index,int player,int color,int rank,pyhanabi_move_t *move)

{
  undefined4 *puVar1;
  
  if (move != (pyhanabi_move_t *)0x0) {
    puVar1 = (undefined4 *)operator_new(8);
    *puVar1 = 7;
    *(char *)(puVar1 + 1) = (char)card_index;
    *(char *)((long)puVar1 + 5) = (char)player;
    *(char *)((long)puVar1 + 6) = (char)color;
    *(char *)((long)puVar1 + 7) = (char)rank;
    move->move = puVar1;
    return true;
  }
  __assert_fail("move != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0xbf,"bool GetDealSpecificMove(int, int, int, int, pyhanabi_move_t *)");
}

Assistant:

bool GetDealSpecificMove(int card_index, int player, int color, int rank, pyhanabi_move_t* move) {
  REQUIRE(move != nullptr);
  move->move = new hanabi_learning_env::HanabiMove(
      hanabi_learning_env::HanabiMove::kDealSpecific, card_index, player, color, rank);
  return move->move != nullptr;
}